

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

short __thiscall
duckdb::Interpolator<false>::Operation<short,short,duckdb::MadAccessor<short,short,short>>
          (Interpolator<false> *this,short *v_t,Vector *result,
          MadAccessor<short,_short,_short> *accessor)

{
  QuantileCompare<duckdb::MadAccessor<short,_short,_short>_> __comp;
  QuantileCompare<duckdb::MadAccessor<short,_short,_short>_> __comp_00;
  QuantileCompare<duckdb::MadAccessor<short,_short,_short>_> __comp_01;
  MadAccessor<short,_short,_short> *in_RCX;
  byte *in_RDI;
  short hi;
  short lo;
  QuantileCompare<duckdb::MadAccessor<short,_short,_short>_> comp;
  short *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa6;
  short *in_stack_ffffffffffffffa8;
  short *in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffc0;
  MadAccessor<short,_short,_short> *in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd0;
  short local_2;
  
  QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>::QuantileCompare
            ((QuantileCompare<duckdb::MadAccessor<short,_short,_short>_> *)&stack0xffffffffffffffc0,
             in_RCX,(bool)(*in_RDI & 1));
  if (*(long *)(in_RDI + 0x18) == *(long *)(in_RDI + 0x10)) {
    __comp.accessor_r = in_stack_ffffffffffffffc8;
    __comp.accessor_l = (MadAccessor<short,_short,_short> *)in_stack_ffffffffffffffc0;
    __comp._16_8_ = in_stack_ffffffffffffffd0;
    std::nth_element<short*,duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>
              ((short *)in_stack_ffffffffffffffc8,(short *)in_stack_ffffffffffffffc0,
               (short *)CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),__comp);
    MadAccessor<short,_short,_short>::operator()
              (in_stack_ffffffffffffffc8,(INPUT_TYPE_conflict *)in_stack_ffffffffffffffc0);
    local_2 = CastInterpolation::Cast<short,short>
                        ((short *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    __comp_00.accessor_r = in_stack_ffffffffffffffc8;
    __comp_00.accessor_l = (MadAccessor<short,_short,_short> *)in_stack_ffffffffffffffc0;
    __comp_00._16_8_ = in_stack_ffffffffffffffd0;
    std::nth_element<short*,duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (short *)CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),__comp_00);
    __comp_01.accessor_r = in_stack_ffffffffffffffc8;
    __comp_01.accessor_l = (MadAccessor<short,_short,_short> *)in_stack_ffffffffffffffc0;
    __comp_01._16_8_ = in_stack_ffffffffffffffd0;
    std::nth_element<short*,duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (short *)CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),__comp_01);
    MadAccessor<short,_short,_short>::operator()
              (in_stack_ffffffffffffffc8,(INPUT_TYPE_conflict *)in_stack_ffffffffffffffc0);
    CastInterpolation::Cast<short,short>
              ((short *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    MadAccessor<short,_short,_short>::operator()
              (in_stack_ffffffffffffffc8,(INPUT_TYPE_conflict *)in_stack_ffffffffffffffc0);
    CastInterpolation::Cast<short,short>
              ((short *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    local_2 = CastInterpolation::Interpolate<short>
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffffd0,
                         (short *)in_stack_ffffffffffffffc8);
  }
  return local_2;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}